

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<kj::_::XThreadEvent_*>::dispose(ArrayBuilder<kj::_::XThreadEvent_*> *this)

{
  XThreadEvent **firstElement;
  RemoveConst<kj::_::XThreadEvent_*> *ppXVar1;
  XThreadEvent **ppXVar2;
  XThreadEvent **endCopy;
  XThreadEvent **posCopy;
  XThreadEvent **ptrCopy;
  ArrayBuilder<kj::_::XThreadEvent_*> *this_local;
  
  firstElement = this->ptr;
  ppXVar1 = this->pos;
  ppXVar2 = this->endPtr;
  if (firstElement != (XThreadEvent **)0x0) {
    this->ptr = (XThreadEvent **)0x0;
    this->pos = (RemoveConst<kj::_::XThreadEvent_*> *)0x0;
    this->endPtr = (XThreadEvent **)0x0;
    ArrayDisposer::dispose<kj::_::XThreadEvent*>
              (this->disposer,firstElement,(long)ppXVar1 - (long)firstElement >> 3,
               (long)ppXVar2 - (long)firstElement >> 3);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }